

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  char ret;
  char local_12;
  char local_11;
  long local_10;
  
  SVar1.m_int = 0x80;
  if (lhs != -0x80 || rhs.m_int != -1) {
    local_11 = '\0';
    local_12 = lhs;
    local_10 = rhs.m_int;
    DivisionHelper<signed_char,_long,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_12,&local_10,&local_11)
    ;
    SVar1.m_int = (long)local_11;
  }
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)SVar1.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}